

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O0

void __thiscall Assimp::D3MF::XmlSerializer::ImportXml(XmlSerializer *this,aiScene *scene)

{
  vector<aiNode_*,_std::allocator<aiNode_*>_> *this_00;
  bool bVar1;
  __type _Var2;
  int iVar3;
  uint index;
  aiNode *this_01;
  undefined4 extraout_var;
  size_type sVar4;
  aiMetadata *paVar5;
  reference pvVar6;
  aiMesh **__s;
  iterator __first;
  iterator __last;
  aiMaterial **ppaVar7;
  iterator __first_00;
  iterator __last_00;
  aiNode **__s_00;
  iterator __first_01;
  iterator __last_01;
  ulong uVar8;
  undefined1 local_47c [8];
  aiString val;
  size_t i;
  size_t numMeta;
  undefined1 local_60 [8];
  string nodeName;
  vector<aiNode_*,_std::allocator<aiNode_*>_> children;
  aiScene *scene_local;
  XmlSerializer *this_local;
  
  if (scene != (aiScene *)0x0) {
    this_01 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(this_01);
    scene->mRootNode = this_01;
    std::vector<aiNode_*,_std::allocator<aiNode_*>_>::vector
              ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)((long)&nodeName.field_2 + 8));
    std::__cxx11::string::string((string *)local_60);
    while (bVar1 = ReadToEndElement(this,(string *)XmlTag::model_abi_cxx11_), bVar1) {
      iVar3 = (*this->xmlReader->_vptr_IIrrXMLReader[0xd])();
      std::__cxx11::string::operator=((string *)local_60,(char *)CONCAT44(extraout_var,iVar3));
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)XmlTag::object_abi_cxx11_);
      if (_Var2) {
        numMeta = (size_t)ReadObject(this,scene);
        std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                  ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)((long)&nodeName.field_2 + 8),
                   (value_type *)&numMeta);
      }
      else {
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_60,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )XmlTag::build_abi_cxx11_);
        if (!_Var2) {
          _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_60,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)XmlTag::basematerials_abi_cxx11_);
          if (_Var2) {
            ReadBaseMaterials(this);
          }
          else {
            _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_60,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)XmlTag::meta_abi_cxx11_);
            if (_Var2) {
              ReadMetadata(this);
            }
          }
        }
      }
    }
    if ((scene->mRootNode->mName).length == 0) {
      aiString::Set(&scene->mRootNode->mName,"3MF");
    }
    bVar1 = std::
            vector<Assimp::D3MF::XmlSerializer::MetaEntry,_std::allocator<Assimp::D3MF::XmlSerializer::MetaEntry>_>
            ::empty(&this->mMetaData);
    if (!bVar1) {
      sVar4 = std::
              vector<Assimp::D3MF::XmlSerializer::MetaEntry,_std::allocator<Assimp::D3MF::XmlSerializer::MetaEntry>_>
              ::size(&this->mMetaData);
      i._0_4_ = (uint)sVar4;
      paVar5 = aiMetadata::Alloc((uint)i);
      scene->mMetaData = paVar5;
      val.data[0x3f8] = '\0';
      val.data[0x3f9] = '\0';
      val.data[0x3fa] = '\0';
      val.data[0x3fb] = '\0';
      val.data[0x3fc] = '\0';
      val.data[0x3fd] = '\0';
      val.data[0x3fe] = '\0';
      val.data[0x3ff] = '\0';
      for (; (ulong)val.data._1016_8_ < sVar4; val.data._1016_8_ = val.data._1016_8_ + 1) {
        pvVar6 = std::
                 vector<Assimp::D3MF::XmlSerializer::MetaEntry,_std::allocator<Assimp::D3MF::XmlSerializer::MetaEntry>_>
                 ::operator[](&this->mMetaData,val.data._1016_8_);
        aiString::aiString((aiString *)local_47c,&pvVar6->value);
        paVar5 = scene->mMetaData;
        index = val.data._1016_4_;
        pvVar6 = std::
                 vector<Assimp::D3MF::XmlSerializer::MetaEntry,_std::allocator<Assimp::D3MF::XmlSerializer::MetaEntry>_>
                 ::operator[](&this->mMetaData,val.data._1016_8_);
        aiMetadata::Set<aiString>(paVar5,index,&pvVar6->name,(aiString *)local_47c);
      }
    }
    sVar4 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(&this->mMeshes);
    scene->mNumMeshes = (uint)sVar4;
    uVar8 = (ulong)scene->mNumMeshes << 3;
    __s = (aiMesh **)operator_new__(uVar8);
    memset(__s,0,uVar8);
    scene->mMeshes = __s;
    __first = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::begin(&this->mMeshes);
    __last = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::end(&this->mMeshes);
    std::
    copy<__gnu_cxx::__normal_iterator<aiMesh**,std::vector<aiMesh*,std::allocator<aiMesh*>>>,aiMesh**>
              ((__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>)
               __first._M_current,
               (__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>)
               __last._M_current,scene->mMeshes);
    sVar4 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size(&this->mMatArray);
    scene->mNumMaterials = (uint)sVar4;
    if (scene->mNumMaterials != 0) {
      ppaVar7 = (aiMaterial **)operator_new__((ulong)scene->mNumMaterials << 3);
      scene->mMaterials = ppaVar7;
      __first_00 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::begin(&this->mMatArray)
      ;
      __last_00 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::end(&this->mMatArray);
      std::
      copy<__gnu_cxx::__normal_iterator<aiMaterial**,std::vector<aiMaterial*,std::allocator<aiMaterial*>>>,aiMaterial**>
                ((__normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
                  )__first_00._M_current,
                 (__normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
                  )__last_00._M_current,scene->mMaterials);
    }
    sVar4 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::size
                      ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)((long)&nodeName.field_2 + 8))
    ;
    scene->mRootNode->mNumChildren = (uint)sVar4;
    uVar8 = (ulong)scene->mRootNode->mNumChildren << 3;
    __s_00 = (aiNode **)operator_new__(uVar8);
    memset(__s_00,0,uVar8);
    scene->mRootNode->mChildren = __s_00;
    this_00 = (vector<aiNode_*,_std::allocator<aiNode_*>_> *)((long)&nodeName.field_2 + 8);
    __first_01 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::begin(this_00);
    __last_01 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::end(this_00);
    std::
    copy<__gnu_cxx::__normal_iterator<aiNode**,std::vector<aiNode*,std::allocator<aiNode*>>>,aiNode**>
              ((__normal_iterator<aiNode_**,_std::vector<aiNode_*,_std::allocator<aiNode_*>_>_>)
               __first_01._M_current,
               (__normal_iterator<aiNode_**,_std::vector<aiNode_*,_std::allocator<aiNode_*>_>_>)
               __last_01._M_current,scene->mRootNode->mChildren);
    std::__cxx11::string::~string((string *)local_60);
    std::vector<aiNode_*,_std::allocator<aiNode_*>_>::~vector
              ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)((long)&nodeName.field_2 + 8));
  }
  return;
}

Assistant:

void ImportXml(aiScene* scene) {
        if ( nullptr == scene ) {
            return;
        }

        scene->mRootNode = new aiNode();
        std::vector<aiNode*> children;

        std::string nodeName;
        while(ReadToEndElement(D3MF::XmlTag::model)) {
            nodeName = xmlReader->getNodeName();
            if( nodeName == D3MF::XmlTag::object) {
                children.push_back(ReadObject(scene));
            } else if( nodeName == D3MF::XmlTag::build) {
                // 
            } else if ( nodeName == D3MF::XmlTag::basematerials ) {
                ReadBaseMaterials();
            } else if ( nodeName == D3MF::XmlTag::meta ) {
                ReadMetadata();
            }
        }

        if ( scene->mRootNode->mName.length == 0 ) {
            scene->mRootNode->mName.Set( "3MF" );
        }

        // import the metadata
        if ( !mMetaData.empty() ) {
            const size_t numMeta( mMetaData.size() );
            scene->mMetaData = aiMetadata::Alloc(static_cast<unsigned int>( numMeta ) );
            for ( size_t i = 0; i < numMeta; ++i ) {
                aiString val( mMetaData[ i ].value );
                scene->mMetaData->Set(static_cast<unsigned int>( i ), mMetaData[ i ].name, val );
            }
        }

        // import the meshes
        scene->mNumMeshes = static_cast<unsigned int>( mMeshes.size());
        scene->mMeshes = new aiMesh*[scene->mNumMeshes]();
        std::copy( mMeshes.begin(), mMeshes.end(), scene->mMeshes);

        // import the materials
        scene->mNumMaterials = static_cast<unsigned int>( mMatArray.size() );
        if ( 0 != scene->mNumMaterials ) {
            scene->mMaterials = new aiMaterial*[ scene->mNumMaterials ];
            std::copy( mMatArray.begin(), mMatArray.end(), scene->mMaterials );
        }

        // create the scenegraph
        scene->mRootNode->mNumChildren = static_cast<unsigned int>(children.size());
        scene->mRootNode->mChildren = new aiNode*[scene->mRootNode->mNumChildren]();
        std::copy(children.begin(), children.end(), scene->mRootNode->mChildren);
    }